

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O0

void rlvl_destroy(jpc_enc_rlvl_t *rlvl)

{
  ulong local_20;
  uint_fast16_t bandno;
  jpc_enc_band_t *band;
  jpc_enc_rlvl_t *rlvl_local;
  
  if (rlvl->bands != (jpc_enc_band_t *)0x0) {
    local_20 = 0;
    bandno = (uint_fast16_t)rlvl->bands;
    for (; local_20 < rlvl->numbands; local_20 = local_20 + 1) {
      band_destroy((jpc_enc_band_t *)bandno);
      bandno = bandno + 0x40;
    }
    jas_free(rlvl->bands);
    rlvl->bands = (jpc_enc_band_t *)0x0;
  }
  return;
}

Assistant:

static void rlvl_destroy(jpc_enc_rlvl_t *rlvl)
{
	jpc_enc_band_t *band;
	uint_fast16_t bandno;

	if (rlvl->bands) {
		for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
		  ++bandno, ++band) {
			band_destroy(band);
		}
		jas_free(rlvl->bands);
		rlvl->bands = NULL;
	}
}